

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteorder.c
# Opt level: O3

Token * has_tok_dollar(List *ls,TokenType type,int number)

{
  Token *pTVar1;
  
  if (ls == (List *)0x0) {
    return (Token *)0x0;
  }
  do {
    if (((ls->token).type == type) && ((uint)(ls->token).u.reginfo.which == number)) {
      return &ls->token;
    }
    pTVar1 = has_tok_dollar(ls->car,type,number);
    if (pTVar1 != (Token *)0x0) {
      return pTVar1;
    }
    ls = ls->cdr;
  } while (ls != (ListStruct *)0x0);
  return (Token *)0x0;
}

Assistant:

static Token *
has_tok_dollar (List *ls, TokenType type, int number)
{
  Token *t;

  if (ls == NULL)
    return NULL;
  if (ls->token.type == type
      && ls->token.u.dollarinfo.which == number)
    return &ls->token;
  t = has_tok_dollar (ls->car, type, number);
  if (t != NULL)
    return t;
  return has_tok_dollar (ls->cdr, type, number);
}